

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper1.cpp
# Opt level: O3

void master_table_lookup_dictionary
               (planck_unit_test_t *tc,MasterTable *master_table,ion_dictionary_id_t id,
               ion_key_type_t key_type,ion_key_size_t key_size,ion_value_size_t value_size,
               ion_dictionary_size_t dictionary_size,ion_dictionary_type_t dictionary_type,
               ion_dictionary_config_info_t *config,ion_boolean_t expect_found)

{
  ion_err_t iVar1;
  planck_unit_result_t pVar2;
  int line;
  ion_dictionary_type_t actual;
  
  iVar1 = ion_lookup_in_master_table(id,config);
  actual = (ion_dictionary_type_t)iVar1;
  if (expect_found == '\0') {
    dictionary_type = dictionary_type_flat_file_t;
    line = 0x9c;
  }
  else {
    pVar2 = planck_unit_assert_int_are_equal
                      (tc,0,actual,0x93,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test1/test_cpp_wrapper1.cpp"
                      );
    if (pVar2 == '\0') goto LAB_00103681;
    pVar2 = planck_unit_assert_int_are_equal
                      (tc,id,config->id,0x94,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test1/test_cpp_wrapper1.cpp"
                      );
    if (pVar2 == '\0') goto LAB_00103681;
    pVar2 = planck_unit_assert_int_are_equal
                      (tc,key_type,config->type,0x95,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test1/test_cpp_wrapper1.cpp"
                      );
    if (pVar2 == '\0') goto LAB_00103681;
    pVar2 = planck_unit_assert_int_are_equal
                      (tc,key_size,config->key_size,0x96,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test1/test_cpp_wrapper1.cpp"
                      );
    if (pVar2 == '\0') goto LAB_00103681;
    pVar2 = planck_unit_assert_int_are_equal
                      (tc,value_size,config->value_size,0x97,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test1/test_cpp_wrapper1.cpp"
                      );
    if (pVar2 == '\0') goto LAB_00103681;
    pVar2 = planck_unit_assert_int_are_equal
                      (tc,dictionary_size,config->dictionary_size,0x98,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test1/test_cpp_wrapper1.cpp"
                      );
    if (pVar2 == '\0') goto LAB_00103681;
    actual = config->dictionary_type;
    line = 0x99;
  }
  pVar2 = planck_unit_assert_int_are_equal
                    (tc,dictionary_type,actual,line,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test1/test_cpp_wrapper1.cpp"
                    );
  if (pVar2 != '\0') {
    return;
  }
LAB_00103681:
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
master_table_lookup_dictionary(
	planck_unit_test_t				*tc,
	MasterTable						*master_table,
	ion_dictionary_id_t				id,
	ion_key_type_t					key_type,
	ion_key_size_t					key_size,
	ion_value_size_t				value_size,
	ion_dictionary_size_t			dictionary_size,
	ion_dictionary_type_t			dictionary_type,
	ion_dictionary_config_info_t	*config,
	ion_boolean_t					expect_found
) {
	ion_err_t err = master_table->lookupMasterTable(id, config);

	if (expect_found) {
		PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, err_ok, err);
		PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, id, config->id);
		PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, key_type, config->type);
		PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, key_size, config->key_size);
		PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, value_size, config->value_size);
		PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, dictionary_size, config->dictionary_size);
		PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, dictionary_type, config->dictionary_type);
	}
	else {
		PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, err_item_not_found, err);
	}
}